

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O1

void algorithm_suite::copy_sequence(void)

{
  double dVar1;
  bool bVar2;
  double dVar3;
  initializer_list<double> __l;
  vector<double,_std::allocator<double>_> input;
  undefined8 local_58;
  vector<double,_std::allocator<double>_> local_50;
  double local_38 [5];
  
  local_38[2] = 3.0;
  local_38[3] = 4.0;
  local_38[0] = 1.0;
  local_38[1] = 2.0;
  local_38[4] = 5.0;
  __l._M_len = 5;
  __l._M_array = local_38;
  std::vector<double,_std::allocator<double>_>::vector(&local_50,__l,(allocator_type *)&local_58);
  local_38[0] = (double)((long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                         (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start >> 3);
  if ((long)local_38[0] < 1) {
    dVar3 = 0.0;
    local_38[0] = 0.0;
  }
  else {
    dVar3 = 0.0;
    dVar1 = 4.94065645841247e-324;
    do {
      dVar3 = (local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[(long)dVar1 + -1] - dVar3) / (double)(long)dVar1 +
              dVar3;
      bVar2 = dVar1 != local_38[0];
      dVar1 = (double)((long)dVar1 + 1);
    } while (bVar2);
  }
  local_58 = CONCAT44(local_58._4_4_,5);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","5",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,0x2cc,"void algorithm_suite::copy_sequence()",local_38,(allocator_type *)&local_58,
             dVar3);
  local_58 = 0x4008000000000000;
  local_38[0] = dVar3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","3.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,0x2cd,"void algorithm_suite::copy_sequence()",local_38,(allocator_type *)&local_58);
  if (local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void copy_sequence()
{
    std::vector<double> input = { 1.0, 2.0, 3.0, 4.0, 5.0 };
    cumulative::moment<double> filter;
    std::copy(input.begin(), input.end(), push_inserter(filter));
    TRIAL_TEST_EQ(filter.size(), 5);
    TRIAL_TEST_EQ(filter.mean(), 3.0);
}